

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O3

void __thiscall CLayers::InitTilemapSkip(CLayers *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  char cVar12;
  long lVar13;
  long lVar6;
  undefined4 extraout_var_01;
  
  if (0 < this->m_GroupsNum) {
    iVar5 = 0;
    do {
      iVar3 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[5])
                        (this->m_pMap,(ulong)(uint)(this->m_GroupsStart + iVar5),0,0);
      lVar6 = CONCAT44(extraout_var,iVar3);
      if (0 < *(int *)(lVar6 + 0x18)) {
        iVar3 = 0;
        do {
          iVar4 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[5])
                            (this->m_pMap,
                             (ulong)(uint)(*(int *)(lVar6 + 0x14) + iVar3 + this->m_LayersStart),0);
          lVar10 = CONCAT44(extraout_var_00,iVar4);
          if (*(int *)(lVar10 + 4) == 2) {
            iVar4 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[2])();
            lVar7 = CONCAT44(extraout_var_01,iVar4);
            iVar4 = *(int *)(lVar10 + 0x14);
            if (0 < iVar4) {
              iVar1 = *(int *)(lVar10 + 0x10);
              iVar8 = 0;
              iVar9 = 0;
              do {
                if (1 < iVar1) {
                  iVar11 = 1;
                  do {
                    lVar10 = (long)(iVar1 * iVar9 + iVar11);
                    if ((iVar11 + 1 < iVar1) && (*(char *)(lVar7 + 4 + lVar10 * 4) == '\0')) {
                      lVar2 = 2;
                      do {
                        lVar13 = lVar2;
                        if ((0xfd < lVar13 - 1U) || ((long)iVar1 <= iVar11 + lVar13)) break;
                        lVar2 = lVar13 + 1;
                      } while (*(char *)(lVar7 + (long)(iVar8 + iVar11) * 4 + lVar13 * 4) == '\0');
                      iVar11 = iVar11 + (int)lVar13;
                      cVar12 = (char)lVar13 + -1;
                    }
                    else {
                      cVar12 = '\0';
                      iVar11 = iVar11 + 1;
                    }
                    *(char *)(lVar7 + 2 + lVar10 * 4) = cVar12;
                  } while (iVar11 < iVar1);
                }
                iVar9 = iVar9 + 1;
                iVar8 = iVar8 + iVar1;
              } while (iVar9 != iVar4);
            }
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < *(int *)(lVar6 + 0x18));
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->m_GroupsNum);
  }
  return;
}

Assistant:

void CLayers::InitTilemapSkip()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = (CMapItemLayerTilemap *)pLayer;
				CTile *pTiles = (CTile *)Map()->GetData(pTilemap->m_Data);
				for(int y = 0; y < pTilemap->m_Height; y++)
				{
					for(int x = 1; x < pTilemap->m_Width;)
					{
						int SkippedX;
						for(SkippedX = 1; x+SkippedX < pTilemap->m_Width && SkippedX < 255; SkippedX++)
						{
							if(pTiles[y*pTilemap->m_Width+x+SkippedX].m_Index)
								break;
						}

						pTiles[y*pTilemap->m_Width+x].m_Skip = SkippedX-1;
						x += SkippedX;
					}
				}
			}
		}
	}
}